

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcv.c
# Opt level: O0

int tcv_get_wavelength(tcv_t *tcv)

{
  _Bool _Var1;
  int local_1c;
  int ret;
  tcv_t *tcv_local;
  
  local_1c = -0xd;
  _Var1 = tcv_check_and_lock_ok(tcv);
  if (_Var1) {
    _Var1 = tcv_is_initialized(tcv);
    if (_Var1) {
      local_1c = (*tcv->fun->get_wave_len)(tcv);
    }
    tcv_unlock(tcv);
    tcv_local._4_4_ = local_1c;
  }
  else {
    tcv_local._4_4_ = -4;
  }
  return tcv_local._4_4_;
}

Assistant:

int tcv_get_wavelength(tcv_t *tcv)
{
	int ret = TCV_ERR_NOT_INITIALIZED;

	if (!tcv_check_and_lock_ok(tcv))
		return TCV_ERR_INVALID_ARG;

	if (tcv_is_initialized(tcv)) {
		ret = tcv->fun->get_wave_len(tcv);
	}

	tcv_unlock(tcv);
	return ret;
}